

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingBlockLocationsTest::getProgramInterface
          (VaryingBlockLocationsTest *this,GLuint param_1,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  undefined8 uVar1;
  GLuint offset;
  uint offset_00;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  Interface *interface;
  Interface *block;
  GLubyte *ptr;
  GLuint fourth_offset;
  GLuint third_offset;
  GLuint fifth_offset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_3c [8];
  Type vec4;
  ShaderInterface *si;
  VaryingPassthrough *varying_passthrough_local;
  ProgramInterface *program_interface_local;
  GLuint param_1_local;
  VaryingBlockLocationsTest *this_local;
  
  vec4._4_8_ = Utils::ProgramInterface::GetShaderInterface(program_interface,VERTEX);
  local_3c._0_4_ = (TYPES)Utils::Type::vec4;
  local_3c._4_4_ = Utils::Type::vec4._4_4_;
  vec4.m_basic_type = DAT_032ff584;
  Utils::Type::GenerateData(&local_58,(Type *)local_3c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_third_data,&local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_58);
  Utils::Type::GenerateData(&local_70,(Type *)local_3c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_fourth_data,&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&third_offset,(Type *)local_3c
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_fifth_data,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&third_offset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&third_offset);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_fifth_data);
  offset = (GLuint)sVar2;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_fourth_data);
  offset_00 = offset + (int)sVar3;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_fourth_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_data,offset_00 + sVar3);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_third_data,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_third_data);
  memcpy(pvVar4 + (sVar2 & 0xffffffff),pvVar5,sVar3);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_fourth_data,0);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_fourth_data);
  memcpy(pvVar4 + offset_00,pvVar5,sVar2);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_fifth_data,0);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_fifth_data);
  memcpy(pvVar4,pvVar5,sVar2);
  interface = Utils::ProgramInterface::Block(program_interface,"vs_tcs_Block");
  Utils::Interface::Member(interface,"fifth","",0,4,(Type *)local_3c,'\0',0,0,0);
  Utils::Interface::Member
            (interface,"third","layout (location = 2)",0,2,(Type *)local_3c,'\0',0,0,offset);
  Utils::Interface::Member(interface,"fourth","",0,3,(Type *)local_3c,'\0',0,0,offset_00);
  uVar1 = vec4._4_8_;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
  Utils::ShaderInterface::Output<void>
            ((ShaderInterface *)uVar1,"vs_tcs_block","layout (location = 4)",0,4,interface,0,0,0,
             pvVar4,sVar2);
  uVar1 = vec4._4_8_;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_third_data,0);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_third_data);
  Utils::ShaderInterface::Input<void>
            ((ShaderInterface *)uVar1,"vs_in_third","layout (location = 0)",0,0,(Type *)local_3c,
             '\0',0,0,offset,pvVar4,sVar2);
  uVar1 = vec4._4_8_;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_fourth_data,0);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_fourth_data);
  Utils::ShaderInterface::Input<void>
            ((ShaderInterface *)uVar1,"vs_in_fourth","layout (location = 1)",0,1,(Type *)local_3c,
             '\0',0,0,offset_00,pvVar4,sVar2);
  uVar1 = vec4._4_8_;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_fifth_data,0);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_fifth_data);
  Utils::ShaderInterface::Input<void>
            ((ShaderInterface *)uVar1,"vs_in_fifth","layout (location = 2)",0,2,(Type *)local_3c,
             '\0',0,0,0,pvVar4,sVar2);
  Utils::ProgramInterface::CloneVertexInterface(program_interface,varying_passthrough);
  return;
}

Assistant:

void VaryingBlockLocationsTest::getProgramInterface(GLuint /* test_case_index */,
													Utils::ProgramInterface&   program_interface,
													Utils::VaryingPassthrough& varying_passthrough)
{
	Utils::ShaderInterface& si   = program_interface.GetShaderInterface(Utils::Shader::VERTEX);
	const Utils::Type		vec4 = Utils::Type::vec4;

	/* Prepare data */
	m_third_data  = vec4.GenerateData();
	m_fourth_data = vec4.GenerateData();
	m_fifth_data  = vec4.GenerateData();

	/* Memory layout is different from location layout */
	const GLuint fifth_offset  = 0u;
	const GLuint third_offset  = static_cast<GLuint>(fifth_offset + m_fifth_data.size());
	const GLuint fourth_offset = static_cast<GLuint>(third_offset + m_fourth_data.size());

	m_data.resize(fourth_offset + m_fourth_data.size());
	GLubyte* ptr = (GLubyte*)&m_data[0];
	memcpy(ptr + third_offset, &m_third_data[0], m_third_data.size());
	memcpy(ptr + fourth_offset, &m_fourth_data[0], m_fourth_data.size());
	memcpy(ptr + fifth_offset, &m_fifth_data[0], m_fifth_data.size());

	Utils::Interface* block = program_interface.Block("vs_tcs_Block");

	block->Member("fifth", "" /* qualifiers */, 0 /* component */, 4 /* location */, vec4, false /* normalized */,
				  0u /* n_array_elements */, 0u /* stride */, fifth_offset /* offset */);

	block->Member("third", "layout (location = 2)" /* qualifiers */, 0 /* component */, 2 /* location */, vec4,
				  false /* normalized */, 0u /* n_array_elements */, 0u /* stride */, third_offset /* offset */);

	block->Member("fourth", "" /* qualifiers */, 0 /* component */, 3 /* location */, vec4, false /* normalized */,
				  0u /* n_array_elements */, 0u /* stride */, fourth_offset /* offset */);

	si.Output("vs_tcs_block", "layout (location = 4)", 0 /* component */, 4 /* location */, block,
			  0u /* n_array_elements */, 0u /* stride */, 0u /* offset */, (GLvoid*)&m_data[0] /* data */,
			  m_data.size() /* data_size */);

	si.Input("vs_in_third", "layout (location = 0)", 0 /* component */, 0 /* location */, vec4, false /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, third_offset /* offset */,
			 (GLvoid*)&m_third_data[0] /* data */, m_third_data.size() /* data_size */);

	si.Input("vs_in_fourth", "layout (location = 1)", 0 /* component */, 1 /* location */, vec4, false /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, fourth_offset /* offset */,
			 (GLvoid*)&m_fourth_data[0] /* data */, m_fourth_data.size() /* data_size */);

	si.Input("vs_in_fifth", "layout (location = 2)", 0 /* component */, 2 /* location */, vec4, false /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, fifth_offset /* offset */,
			 (GLvoid*)&m_fifth_data[0] /* data */, m_fifth_data.size() /* data_size */);

	program_interface.CloneVertexInterface(varying_passthrough);
}